

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::appendSupplementary
          (ReorderingBuffer *this,UChar32 c,uint8_t cc,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  uint8_t cc_local;
  UChar32 c_local;
  ReorderingBuffer *this_local;
  
  if ((this->remainingCapacity < 2) && (UVar1 = resize(this,2,errorCode), UVar1 == '\0')) {
    this_local._7_1_ = '\0';
  }
  else {
    if ((cc < this->lastCC) && (cc != '\0')) {
      insert(this,c,cc);
    }
    else {
      *this->limit = (short)(c >> 10) + L'ퟀ';
      this->limit[1] = (ushort)c & 0x3ff | 0xdc00;
      this->limit = this->limit + 2;
      this->lastCC = cc;
      if (cc < 2) {
        this->reorderStart = this->limit;
      }
    }
    this->remainingCapacity = this->remainingCapacity + -2;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool ReorderingBuffer::appendSupplementary(UChar32 c, uint8_t cc, UErrorCode &errorCode) {
    if(remainingCapacity<2 && !resize(2, errorCode)) {
        return FALSE;
    }
    if(lastCC<=cc || cc==0) {
        limit[0]=U16_LEAD(c);
        limit[1]=U16_TRAIL(c);
        limit+=2;
        lastCC=cc;
        if(cc<=1) {
            reorderStart=limit;
        }
    } else {
        insert(c, cc);
    }
    remainingCapacity-=2;
    return TRUE;
}